

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O0

int aom_rb_read_bit(aom_read_bit_buffer *rb)

{
  uint uVar1;
  long *in_RDI;
  int bit;
  int q;
  uint32_t p;
  uint32_t off;
  uint local_4;
  
  uVar1 = *(uint *)(in_RDI + 2);
  if (*in_RDI + (ulong)(uVar1 >> 3) < (ulong)in_RDI[1]) {
    local_4 = (int)(uint)*(byte *)(*in_RDI + (ulong)(uVar1 >> 3)) >> (7 - ((byte)uVar1 & 7) & 0x1f)
              & 1;
    *(uint *)(in_RDI + 2) = uVar1 + 1;
  }
  else {
    if (in_RDI[4] != 0) {
      (*(code *)in_RDI[4])(in_RDI[3]);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_rb_read_bit(struct aom_read_bit_buffer *rb) {
  const uint32_t off = rb->bit_offset;
  const uint32_t p = off >> 3;
  const int q = 7 - (int)(off & 0x7);
  if (rb->bit_buffer + p < rb->bit_buffer_end) {
    const int bit = (rb->bit_buffer[p] >> q) & 1;
    rb->bit_offset = off + 1;
    return bit;
  } else {
    if (rb->error_handler) rb->error_handler(rb->error_handler_data);
    return 0;
  }
}